

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecBit.h
# Opt level: O0

Vec_Bit_t * Vec_BitAlloc(int nCap)

{
  int iVar1;
  Vec_Bit_t *pVVar2;
  int *local_20;
  Vec_Bit_t *p;
  int nCap_local;
  
  iVar1 = (nCap >> 5) + (uint)((nCap & 0x1fU) != 0);
  pVVar2 = (Vec_Bit_t *)malloc(0x10);
  pVVar2->nSize = 0;
  pVVar2->nCap = iVar1 * 0x20;
  if (iVar1 == 0) {
    local_20 = (int *)0x0;
  }
  else {
    local_20 = (int *)malloc((long)iVar1 << 2);
  }
  pVVar2->pArray = local_20;
  return pVVar2;
}

Assistant:

static inline Vec_Bit_t * Vec_BitAlloc( int nCap )
{
    Vec_Bit_t * p;
    nCap = (nCap >> 5) + ((nCap & 31) > 0);
    p = ABC_ALLOC( Vec_Bit_t, 1 );
    p->nSize  = 0;
    p->nCap   = nCap * 32;
    p->pArray = nCap? ABC_ALLOC( int, nCap ) : NULL;
    return p;
}